

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::RemoveAt(BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,int i,int last,uint targetBucket)

{
  int local_34;
  uint targetBucket_local;
  int last_local;
  int i_local;
  BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  if (last < 0) {
    this->buckets[targetBucket] =
         this->entries[i].
         super_DefaultHashedEntry<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         .super_KeyValueEntry<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*>.
         super_ValueEntry<TTD::UtilSupport::TTAutoString_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*>_>
         .super_KeyValueEntryDataLayout2<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*>.
         next;
  }
  else {
    this->entries[last].
    super_DefaultHashedEntry<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*>.
    super_ValueEntry<TTD::UtilSupport::TTAutoString_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*>_>
    .super_KeyValueEntryDataLayout2<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*>.next =
         this->entries[i].
         super_DefaultHashedEntry<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         .super_KeyValueEntry<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*>.
         super_ValueEntry<TTD::UtilSupport::TTAutoString_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*>_>
         .super_KeyValueEntryDataLayout2<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*>.
         next;
  }
  anon_unknown_4::KeyValueEntry<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*>::Clear
            ((KeyValueEntry<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*> *)
             (this->entries + i));
  if (this->freeCount == 0) {
    local_34 = -1;
  }
  else {
    local_34 = this->freeList;
  }
  SetNextFreeEntryIndex(this,this->entries + i,local_34);
  this->freeList = i;
  this->freeCount = this->freeCount + 1;
  if (this->stats != (Type)0x0) {
    DictionaryStats::Remove(this->stats,this->buckets[targetBucket] == -1);
  }
  return;
}

Assistant:

inline void RemoveAt(const int i, const int last, const uint targetBucket)
        {
            if (last < 0)
            {
                buckets[targetBucket] = entries[i].next;
            }
            else
            {
                entries[last].next = entries[i].next;
            }
            entries[i].Clear();
            SetNextFreeEntryIndex(entries[i], freeCount == 0 ? -1 : freeList);
            freeList = i;
            freeCount++;
#if PROFILE_DICTIONARY
            if (stats)
                stats->Remove(buckets[targetBucket] == -1);
#endif
        }